

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O0

void __thiscall SimpleLoggerMgr::removeThread(SimpleLoggerMgr *this,uint64_t tid)

{
  mutex_type *in_RDI;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> *in_stack_ffffffffffffffd0;
  
  std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffffd0,in_RDI);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::erase((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           *)in_stack_ffffffffffffffd0,(key_type *)in_RDI);
  std::unique_lock<std::mutex>::~unique_lock(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

void SimpleLoggerMgr::removeThread(uint64_t tid) {
    std::unique_lock<std::mutex> l(activeThreadsLock);
    activeThreads.erase(tid);
}